

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::rasterization::anon_unknown_0::LineInterpolationTestCase::createInstance
          (LineInterpolationTestCase *this,Context *context)

{
  ostringstream *this_00;
  VkPrimitiveTopology VVar1;
  int iVar2;
  PrimitiveWideness PVar3;
  byte bVar4;
  BaseRenderingTestInstance *this_01;
  VkPhysicalDeviceProperties *pVVar5;
  VkPhysicalDeviceFeatures *pVVar6;
  MessageBuilder *pMVar7;
  NotSupportedError *pNVar8;
  VkFormat *this_02;
  float *value;
  allocator<char> local_1b1;
  MessageBuilder local_1b0;
  
  this_01 = (BaseRenderingTestInstance *)operator_new(0x2c0);
  VVar1 = this->m_primitiveTopology;
  iVar2 = this->m_flags;
  PVar3 = this->m_wideness;
  BaseRenderingTestInstance::BaseRenderingTestInstance
            (this_01,context,(this->super_BaseRenderingTestCase).m_sampleCount,0x100);
  (this_01->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__LineInterpolationTestInstance_00bdc990;
  *(VkPrimitiveTopology *)&this_01[1].super_TestInstance._vptr_TestInstance = VVar1;
  bVar4 = (byte)iVar2;
  *(byte *)((long)&this_01[1].super_TestInstance._vptr_TestInstance + 4) = bVar4 >> 1 & 1;
  *(undefined4 *)&this_01[1].super_TestInstance.m_context = 3;
  *(PrimitiveWideness *)((long)&this_01[1].super_TestInstance.m_context + 4) = PVar3;
  this_01[1].m_renderSize = 0;
  *(undefined1 *)&this_01[1].m_sampleCount = VK_SAMPLE_COUNT_1_BIT;
  this_01[1].m_subpixelBits = 0x3f800000;
  this_02 = &this_01[1].m_imageFormat;
  this_01[1].m_commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       0;
  this_01[1].m_imageFormat = VK_FORMAT_UNDEFINED;
  this_01[1].m_textureFormat.order = R;
  *(undefined8 *)&this_01[1].m_textureFormat.type = 0;
  *(byte *)&this_01[1].m_commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
            m_deviceIface = bVar4 >> 2 & 1;
  pVVar5 = Context::getDeviceProperties(context);
  if ((pVVar5->limits).strictLines == 0) {
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar8,"Strict rasterization is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0xa1c);
LAB_0072ab52:
    __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = *(int *)((long)&this_01[1].super_TestInstance.m_context + 4);
  if (iVar2 == 1) {
    pVVar6 = Context::getDeviceFeatures((this_01->super_TestInstance).m_context);
    if (pVVar6->wideLines == 0) {
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar8,"wide line support required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                 ,0xa26);
      goto LAB_0072ab52;
    }
    pVVar5 = Context::getDeviceProperties(context);
    local_1b0.m_log = ((this_01->super_TestInstance).m_context)->m_testCtx->m_log;
    this_00 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"ALIASED_LINE_WIDTH_RANGE = [");
    pMVar7 = tcu::MessageBuilder::operator<<(&local_1b0,(pVVar5->limits).lineWidthRange);
    std::operator<<((ostream *)&pMVar7->m_str,", ");
    value = (pVVar5->limits).lineWidthRange + 1;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,value);
    std::operator<<((ostream *)&pMVar7->m_str,"]");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    if (*value <= 1.0) {
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"wide line support required",&local_1b1);
      tcu::NotSupportedError::NotSupportedError(pNVar8,(string *)&local_1b0);
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    local_1b0.m_log._0_4_ = 0x40a00000;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)this_02,(float *)&local_1b0);
    local_1b0.m_log = (TestLog *)CONCAT44(local_1b0.m_log._4_4_,0x41200000);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)this_02,(float *)&local_1b0);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)this_02,value);
    this_01[1].m_subpixelBits = (deUint32)*value;
  }
  else if (iVar2 == 0) {
    local_1b0.m_log = (TestLog *)CONCAT44(local_1b0.m_log._4_4_,0x3f800000);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)this_02,
               (long)*(int *)&this_01[1].super_TestInstance.m_context,
               (value_type_conflict2 *)&local_1b0);
  }
  return &this_01->super_TestInstance;
}

Assistant:

virtual TestInstance*		createInstance					(Context& context) const
								{
									return new LineInterpolationTestInstance(context, m_primitiveTopology, m_flags, m_wideness, m_sampleCount);
								}